

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

void sysbvm_io_registerPrimitives(void)

{
  sysbvm_primitiveTable_registerFunction(sysbvm_io_primitive_printLine,"printLine");
  sysbvm_primitiveTable_registerFunction(sysbvm_io_primitive_print,"printLine");
  sysbvm_primitiveTable_registerFunction(sysbvm_io_primitive_writeOntoStdout,"IO::writeOntoStdout");
  sysbvm_primitiveTable_registerFunction(sysbvm_io_primitive_writeOntoStderr,"IO::writeOntoStderr");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_io_primitive_readWholeFileNamedAsString,"IO::readWholeFileNamedAsString");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_io_primitive_readWholeFileNamedAsByteArray,"IO::readWholeFileNamedAsByteArray");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_io_primitive_writeWholeFileNamedWithByteArray,
             "IO::writeWholeFileNamedWithByteArray");
  sysbvm_primitiveTable_registerFunction(sysbvm_io_primitive_halt,"halt");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_io_primitive_haltPrintingBacktrace,"haltPrintingBacktrace");
  return;
}

Assistant:

void sysbvm_io_registerPrimitives(void)
{
    sysbvm_primitiveTable_registerFunction(sysbvm_io_primitive_printLine, "printLine");
    sysbvm_primitiveTable_registerFunction(sysbvm_io_primitive_print, "printLine");

    sysbvm_primitiveTable_registerFunction(sysbvm_io_primitive_writeOntoStdout, "IO::writeOntoStdout");
    sysbvm_primitiveTable_registerFunction(sysbvm_io_primitive_writeOntoStderr, "IO::writeOntoStderr");

    sysbvm_primitiveTable_registerFunction(sysbvm_io_primitive_readWholeFileNamedAsString, "IO::readWholeFileNamedAsString");
    sysbvm_primitiveTable_registerFunction(sysbvm_io_primitive_readWholeFileNamedAsByteArray, "IO::readWholeFileNamedAsByteArray");
    sysbvm_primitiveTable_registerFunction(sysbvm_io_primitive_writeWholeFileNamedWithByteArray, "IO::writeWholeFileNamedWithByteArray");
    sysbvm_primitiveTable_registerFunction(sysbvm_io_primitive_halt, "halt");
    sysbvm_primitiveTable_registerFunction(sysbvm_io_primitive_haltPrintingBacktrace, "haltPrintingBacktrace");
}